

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

mz_bool mz_zip_writer_finalize_archive(mz_zip_archive *pZip)

{
  mz_uint32 mVar1;
  mz_zip_internal_state *pmVar2;
  mz_uint64 mVar3;
  int iVar4;
  size_t sVar5;
  undefined4 local_3b0;
  undefined4 local_3a0;
  undefined2 local_38c;
  undefined2 local_37c;
  mz_uint64 rel_ofs_to_zip64_ecdr;
  mz_uint8 hdr [256];
  mz_uint64 central_dir_size;
  mz_uint64 central_dir_ofs;
  mz_zip_internal_state *pState;
  mz_zip_archive *pZip_local;
  
  if (((pZip == (mz_zip_archive *)0x0) || (pZip->m_pState == (mz_zip_internal_state *)0x0)) ||
     (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING)) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    }
    return 0;
  }
  pmVar2 = pZip->m_pState;
  if (pmVar2->m_zip64 == 0) {
    if ((0xffff < pZip->m_total_files) ||
       (0xffffffff < pZip->m_archive_size + (pmVar2->m_central_dir).m_size + 0x16)) {
      if (pZip != (mz_zip_archive *)0x0) {
        pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
      }
      return 0;
    }
  }
  else if (0xfffffffe < (pmVar2->m_central_dir).m_size) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
    }
    return 0;
  }
  central_dir_size = 0;
  hdr[0xf8] = '\0';
  hdr[0xf9] = '\0';
  hdr[0xfa] = '\0';
  hdr[0xfb] = '\0';
  hdr[0xfc] = '\0';
  hdr[0xfd] = '\0';
  hdr[0xfe] = '\0';
  hdr[0xff] = '\0';
  if (pZip->m_total_files != 0) {
    central_dir_size = pZip->m_archive_size;
    hdr._248_8_ = (pmVar2->m_central_dir).m_size;
    pZip->m_central_directory_file_ofs = central_dir_size;
    sVar5 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,central_dir_size,(pmVar2->m_central_dir).m_p,
                              hdr._248_8_);
    if (sVar5 != hdr._248_8_) {
      if (pZip != (mz_zip_archive *)0x0) {
        pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
      }
      return 0;
    }
    pZip->m_archive_size = hdr._248_8_ + pZip->m_archive_size;
  }
  if (pmVar2->m_zip64 != 0) {
    mVar3 = pZip->m_archive_size;
    memset(&rel_ofs_to_zip64_ecdr,0,0x100);
    rel_ofs_to_zip64_ecdr._0_1_ = 0x50;
    rel_ofs_to_zip64_ecdr._1_1_ = 0x4b;
    rel_ofs_to_zip64_ecdr._2_1_ = 6;
    rel_ofs_to_zip64_ecdr._3_1_ = 6;
    rel_ofs_to_zip64_ecdr._4_1_ = 0x2c;
    rel_ofs_to_zip64_ecdr._5_1_ = 0;
    rel_ofs_to_zip64_ecdr._6_1_ = 0;
    rel_ofs_to_zip64_ecdr._7_1_ = 0;
    hdr[0] = '\0';
    hdr[1] = '\0';
    hdr[2] = '\0';
    hdr[3] = '\0';
    hdr[4] = '\x1e';
    hdr[5] = '\x03';
    hdr[6] = '-';
    hdr[7] = '\0';
    mVar1 = pZip->m_total_files;
    hdr[0x10] = (mz_uint8)mVar1;
    hdr[0x11] = (mz_uint8)(mVar1 >> 8);
    hdr[0x12] = (mz_uint8)(mVar1 >> 0x10);
    hdr[0x13] = (mz_uint8)(mVar1 >> 0x18);
    hdr[0x14] = '\0';
    hdr[0x15] = '\0';
    hdr[0x16] = '\0';
    hdr[0x17] = '\0';
    mVar1 = pZip->m_total_files;
    hdr[0x18] = (mz_uint8)mVar1;
    hdr[0x19] = (mz_uint8)(mVar1 >> 8);
    hdr[0x1a] = (mz_uint8)(mVar1 >> 0x10);
    hdr[0x1b] = (mz_uint8)(mVar1 >> 0x18);
    hdr[0x1c] = '\0';
    hdr[0x1d] = '\0';
    hdr[0x1e] = '\0';
    hdr[0x1f] = '\0';
    hdr[0x20] = (mz_uint8)hdr._248_8_;
    hdr[0x21] = SUB81(hdr._248_8_,1);
    hdr[0x22] = SUB81(hdr._248_8_,2);
    hdr[0x23] = SUB81(hdr._248_8_,3);
    hdr[0x24] = SUB81(hdr._248_8_,4);
    hdr[0x25] = SUB81(hdr._248_8_,5);
    hdr[0x26] = SUB81(hdr._248_8_,6);
    hdr[0x27] = SUB81(hdr._248_8_,7);
    hdr[0x28] = (mz_uint8)central_dir_size;
    hdr[0x29] = (mz_uint8)(central_dir_size >> 8);
    hdr[0x2a] = (mz_uint8)(central_dir_size >> 0x10);
    hdr[0x2b] = (mz_uint8)(central_dir_size >> 0x18);
    hdr[0x2c] = (mz_uint8)(central_dir_size >> 0x20);
    hdr[0x2d] = (mz_uint8)(central_dir_size >> 0x28);
    hdr[0x2e] = (mz_uint8)(central_dir_size >> 0x30);
    hdr[0x2f] = (mz_uint8)(central_dir_size >> 0x38);
    sVar5 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,pZip->m_archive_size,&rel_ofs_to_zip64_ecdr,0x38);
    if (sVar5 != 0x38) {
      if (pZip != (mz_zip_archive *)0x0) {
        pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
      }
      return 0;
    }
    pZip->m_archive_size = pZip->m_archive_size + 0x38;
    memset(&rel_ofs_to_zip64_ecdr,0,0x100);
    rel_ofs_to_zip64_ecdr._0_1_ = 0x50;
    rel_ofs_to_zip64_ecdr._1_1_ = 0x4b;
    rel_ofs_to_zip64_ecdr._2_1_ = 6;
    rel_ofs_to_zip64_ecdr._3_1_ = 7;
    hdr[0] = (mz_uint8)mVar3;
    hdr[1] = (mz_uint8)(mVar3 >> 8);
    hdr[2] = (mz_uint8)(mVar3 >> 0x10);
    hdr[3] = (mz_uint8)(mVar3 >> 0x18);
    hdr[4] = (mz_uint8)(mVar3 >> 0x20);
    hdr[5] = (mz_uint8)(mVar3 >> 0x28);
    hdr[6] = (mz_uint8)(mVar3 >> 0x30);
    hdr[7] = (mz_uint8)(mVar3 >> 0x38);
    hdr[8] = '\x01';
    hdr[9] = '\0';
    hdr[10] = '\0';
    hdr[0xb] = '\0';
    sVar5 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,pZip->m_archive_size,&rel_ofs_to_zip64_ecdr,0x14);
    if (sVar5 != 0x14) {
      if (pZip != (mz_zip_archive *)0x0) {
        pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
      }
      return 0;
    }
    pZip->m_archive_size = pZip->m_archive_size + 0x14;
  }
  memset(&rel_ofs_to_zip64_ecdr,0,0x100);
  rel_ofs_to_zip64_ecdr._0_1_ = 0x50;
  rel_ofs_to_zip64_ecdr._1_1_ = 0x4b;
  rel_ofs_to_zip64_ecdr._2_1_ = 5;
  rel_ofs_to_zip64_ecdr._3_1_ = 6;
  if (pZip->m_total_files < 0x10000) {
    local_37c = (undefined2)pZip->m_total_files;
  }
  else {
    local_37c = 0xffff;
  }
  hdr[0] = (mz_uint8)local_37c;
  hdr[1] = (mz_uint8)((ushort)local_37c >> 8);
  if (pZip->m_total_files < 0x10000) {
    local_38c = (undefined2)pZip->m_total_files;
  }
  else {
    local_38c = 0xffff;
  }
  hdr[2] = (mz_uint8)local_38c;
  hdr[3] = (mz_uint8)((ushort)local_38c >> 8);
  if ((ulong)hdr._248_8_ < 0x100000000) {
    local_3a0 = (undefined4)hdr._248_8_;
  }
  else {
    local_3a0 = 0xffffffff;
  }
  hdr[4] = (mz_uint8)local_3a0;
  hdr[5] = (mz_uint8)((uint)local_3a0 >> 8);
  hdr[6] = (mz_uint8)((uint)local_3a0 >> 0x10);
  hdr[7] = (mz_uint8)((uint)local_3a0 >> 0x18);
  if (central_dir_size < 0x100000000) {
    local_3b0 = (undefined4)central_dir_size;
  }
  else {
    local_3b0 = 0xffffffff;
  }
  hdr[8] = (mz_uint8)local_3b0;
  hdr[9] = (mz_uint8)((uint)local_3b0 >> 8);
  hdr[10] = (mz_uint8)((uint)local_3b0 >> 0x10);
  hdr[0xb] = (mz_uint8)((uint)local_3b0 >> 0x18);
  sVar5 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,pZip->m_archive_size,&rel_ofs_to_zip64_ecdr,0x16);
  if (sVar5 == 0x16) {
    if ((pmVar2->m_pFile == (FILE *)0x0) || (iVar4 = fflush((FILE *)pmVar2->m_pFile), iVar4 != -1))
    {
      pZip->m_archive_size = pZip->m_archive_size + 0x16;
      pZip->m_zip_mode = MZ_ZIP_MODE_WRITING_HAS_BEEN_FINALIZED;
      pZip_local._0_4_ = 1;
    }
    else {
      if (pZip != (mz_zip_archive *)0x0) {
        pZip->m_last_error = MZ_ZIP_FILE_CLOSE_FAILED;
      }
      pZip_local._0_4_ = 0;
    }
  }
  else {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
    }
    pZip_local._0_4_ = 0;
  }
  return (mz_bool)pZip_local;
}

Assistant:

mz_bool mz_zip_writer_finalize_archive(mz_zip_archive *pZip)
{
    mz_zip_internal_state *pState;
    mz_uint64 central_dir_ofs, central_dir_size;
    mz_uint8 hdr[256];

    if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    if (pState->m_zip64)
    {
        if ((mz_uint64)pState->m_central_dir.m_size >= MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }
    else
    {
        if ((pZip->m_total_files > MZ_UINT16_MAX) || ((pZip->m_archive_size + pState->m_central_dir.m_size + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE) > MZ_UINT32_MAX))
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }

    central_dir_ofs = 0;
    central_dir_size = 0;
    if (pZip->m_total_files)
    {
        /* Write central directory */
        central_dir_ofs = pZip->m_archive_size;
        central_dir_size = pState->m_central_dir.m_size;
        pZip->m_central_directory_file_ofs = central_dir_ofs;
        if (pZip->m_pWrite(pZip->m_pIO_opaque, central_dir_ofs, pState->m_central_dir.m_p, (size_t)central_dir_size) != central_dir_size)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        pZip->m_archive_size += central_dir_size;
    }

    if (pState->m_zip64)
    {
        /* Write zip64 end of central directory header */
        mz_uint64 rel_ofs_to_zip64_ecdr = pZip->m_archive_size;

        MZ_CLEAR_ARR(hdr);
        MZ_WRITE_LE32(hdr + MZ_ZIP64_ECDH_SIG_OFS, MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIG);
        MZ_WRITE_LE64(hdr + MZ_ZIP64_ECDH_SIZE_OF_RECORD_OFS, MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE - sizeof(mz_uint32) - sizeof(mz_uint64));
        MZ_WRITE_LE16(hdr + MZ_ZIP64_ECDH_VERSION_MADE_BY_OFS, 0x031E); /* TODO: always Unix */
        MZ_WRITE_LE16(hdr + MZ_ZIP64_ECDH_VERSION_NEEDED_OFS, 0x002D);
        MZ_WRITE_LE64(hdr + MZ_ZIP64_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS, pZip->m_total_files);
        MZ_WRITE_LE64(hdr + MZ_ZIP64_ECDH_CDIR_TOTAL_ENTRIES_OFS, pZip->m_total_files);
        MZ_WRITE_LE64(hdr + MZ_ZIP64_ECDH_CDIR_SIZE_OFS, central_dir_size);
        MZ_WRITE_LE64(hdr + MZ_ZIP64_ECDH_CDIR_OFS_OFS, central_dir_ofs);
        if (pZip->m_pWrite(pZip->m_pIO_opaque, pZip->m_archive_size, hdr, MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE) != MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        pZip->m_archive_size += MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE;

        /* Write zip64 end of central directory locator */
        MZ_CLEAR_ARR(hdr);
        MZ_WRITE_LE32(hdr + MZ_ZIP64_ECDL_SIG_OFS, MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIG);
        MZ_WRITE_LE64(hdr + MZ_ZIP64_ECDL_REL_OFS_TO_ZIP64_ECDR_OFS, rel_ofs_to_zip64_ecdr);
        MZ_WRITE_LE32(hdr + MZ_ZIP64_ECDL_TOTAL_NUMBER_OF_DISKS_OFS, 1);
        if (pZip->m_pWrite(pZip->m_pIO_opaque, pZip->m_archive_size, hdr, MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE) != MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        pZip->m_archive_size += MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE;
    }

    /* Write end of central directory record */
    MZ_CLEAR_ARR(hdr);
    MZ_WRITE_LE32(hdr + MZ_ZIP_ECDH_SIG_OFS, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG);
    MZ_WRITE_LE16(hdr + MZ_ZIP_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS, MZ_MIN(MZ_UINT16_MAX, pZip->m_total_files));
    MZ_WRITE_LE16(hdr + MZ_ZIP_ECDH_CDIR_TOTAL_ENTRIES_OFS, MZ_MIN(MZ_UINT16_MAX, pZip->m_total_files));
    MZ_WRITE_LE32(hdr + MZ_ZIP_ECDH_CDIR_SIZE_OFS, MZ_MIN(MZ_UINT32_MAX, central_dir_size));
    MZ_WRITE_LE32(hdr + MZ_ZIP_ECDH_CDIR_OFS_OFS, MZ_MIN(MZ_UINT32_MAX, central_dir_ofs));

    if (pZip->m_pWrite(pZip->m_pIO_opaque, pZip->m_archive_size, hdr, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE) != MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

#ifndef MINIZ_NO_STDIO
    if ((pState->m_pFile) && (MZ_FFLUSH(pState->m_pFile) == EOF))
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_CLOSE_FAILED);
#endif /* #ifndef MINIZ_NO_STDIO */

    pZip->m_archive_size += MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE;

    pZip->m_zip_mode = MZ_ZIP_MODE_WRITING_HAS_BEEN_FINALIZED;
    return MZ_TRUE;
}